

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<short>::emplace<short&>(QPodArrayOps<short> *this,qsizetype i,short *args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  short *psVar3;
  short *in_RDX;
  QArrayDataPointer<short> *in_RSI;
  QArrayDataPointer<short> *in_RDI;
  short *where;
  GrowthPosition pos;
  short tmp;
  bool detach;
  QArrayDataPointer<short> *in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  short sVar5;
  undefined1 in_stack_ffffffffffffffe6;
  
  uVar1 = QArrayDataPointer<short>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<short> *)in_RDI->size) &&
       (qVar2 = QArrayDataPointer<short>::freeSpaceAtEnd(in_stack_ffffffffffffffd8), qVar2 != 0)) {
      psVar3 = QArrayDataPointer<short>::end(in_RDI);
      *psVar3 = *in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == (QArrayDataPointer<short> *)0x0) &&
       (qVar2 = QArrayDataPointer<short>::freeSpaceAtBegin(in_stack_ffffffffffffffd8), qVar2 != 0))
    {
      psVar3 = QArrayDataPointer<short>::begin((QArrayDataPointer<short> *)0x1eba67);
      psVar3[-1] = *in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  sVar5 = *in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<short> *)0x0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<short>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffe6,CONCAT24(sVar5,uVar4))),
             (short **)in_stack_ffffffffffffffd8,in_RDI);
  psVar3 = createHole((QPodArrayOps<short> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffe6,CONCAT24(sVar5,uVar4))),
                      (qsizetype)in_stack_ffffffffffffffd8);
  *psVar3 = sVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }